

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::OptConstFoldUnary
          (GlobOpt *this,Instr **pInstr,int32 intConstantValue,bool isUsingOriginalSrc1Value,
          Value **pDstVal)

{
  OpCode OVar1;
  Instr *pIVar2;
  GlobOpt *dst;
  StackSym *pSVar3;
  Opnd *this_00;
  uint uVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  bool bVar8;
  BailOutKind BVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  IntConstOpnd *newSrc;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  Value *pVVar15;
  undefined1 *puVar16;
  char *this_01;
  bool bVar17;
  double local_48;
  
  bVar6 = DoConstFold(this);
  if (!bVar6) {
    return false;
  }
  if (((*pInstr)->m_dst != (Opnd *)0x0) &&
     (OVar7 = IR::Opnd::GetKind((*pInstr)->m_dst), OVar7 != OpndKindReg)) {
    return false;
  }
  pIVar2 = *pInstr;
  OVar1 = pIVar2->m_opcode;
  bVar6 = false;
  if (OVar1 < ToVar) {
    switch(OVar1) {
    case Incr_A:
      uVar4 = intConstantValue + 1;
      if (SCARRY4(intConstantValue,1)) {
        return false;
      }
      break;
    case Decr_A:
      uVar4 = intConstantValue - 1;
      if (SBORROW4(intConstantValue,1)) {
        return false;
      }
      break;
    case Neg_A:
      if ((intConstantValue & 0x7fffffffU) == 0) {
        return false;
      }
      uVar4 = -intConstantValue;
      break;
    case Not_A:
      uVar4 = ~intConstantValue;
      break;
    default:
      if (OVar1 != Conv_Num) {
        if (OVar1 != Ld_A) {
          return false;
        }
        if ((pIVar2->field_0x38 & 0x10) != 0) {
          BVar9 = IR::Instr::GetBailOutKind(pIVar2);
          if (BVar9 == BailOutExpectingString) {
            puVar16 = (undefined1 *)__cxa_allocate_exception(1);
            *puVar16 = 0x23;
            __cxa_throw(puVar16,&Js::RejitException::typeinfo,0);
          }
          BVar9 = IR::Instr::GetBailOutKind(*pInstr);
          if (BVar9 != BailOutExpectingInteger) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar12 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1c2d,"(instr->GetBailOutKind() == IR::BailOutExpectingInteger)",
                               "instr->GetBailOutKind() == IR::BailOutExpectingInteger");
            if (!bVar6) goto LAB_0045c380;
            *puVar12 = 0;
          }
          IR::Instr::ClearBailOutInfo(*pInstr);
        }
      }
LAB_0045bb48:
      bVar17 = !isUsingOriginalSrc1Value;
      bVar6 = true;
      local_48 = 0.0;
      goto LAB_0045bd6e;
    }
    goto LAB_0045bd5f;
  }
  switch(OVar1) {
  case InlineMathAcos:
    local_48 = Js::Math::Acos((double)intConstantValue);
    break;
  case InlineMathAsin:
    local_48 = Js::Math::Asin((double)intConstantValue);
    break;
  case InlineMathAtan:
    local_48 = Js::Math::Atan((double)intConstantValue);
    break;
  case InlineMathAtan2:
  case InlineMathPow:
  case Clz:
  case InlineMathMax:
  case InlineMathImul:
  case InlineMathMin:
  case InlineMathRandom:
    goto switchD_0045ba62_caseD_252;
  case InlineMathCos:
    local_48 = Js::Math::Cos((double)intConstantValue);
    break;
  case InlineMathExp:
    local_48 = Js::Math::Exp((double)intConstantValue);
    break;
  case InlineMathLog:
    local_48 = Js::Math::Log((double)intConstantValue);
    break;
  case InlineMathSin:
    local_48 = Js::Math::Sin((double)intConstantValue);
    break;
  case InlineMathSqrt:
    local_48 = (double)intConstantValue;
    if (local_48 < 0.0) {
      local_48 = sqrt(local_48);
    }
    else {
      local_48 = SQRT(local_48);
    }
    break;
  case InlineMathTan:
    local_48 = tan((double)intConstantValue);
    break;
  case InlineMathAbs:
    uVar4 = intConstantValue;
    if (intConstantValue < 1) {
      uVar4 = -intConstantValue;
    }
    goto LAB_0045bd5f;
  case InlineMathClz:
    if (intConstantValue == 0) {
      intConstantValue = 0x20;
    }
    else {
      uVar4 = 0x1f;
      if (intConstantValue != 0) {
        for (; (uint)intConstantValue >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      intConstantValue = uVar4 ^ 0x1f;
    }
    goto switchD_0045ba62_caseD_25e;
  case Ctz:
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    bVar6 = JITTimeFunctionBody::IsWasmFunction(pJVar13);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca3,"(func->GetJITFunctionBody()->IsWasmFunction())",
                         "func->GetJITFunctionBody()->IsWasmFunction()");
      if (!bVar6) goto LAB_0045c380;
      *puVar12 = 0;
    }
    if (((*pInstr)->field_0x38 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca4,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
      if (!bVar6) goto LAB_0045c380;
      *puVar12 = 0;
    }
    if (intConstantValue == 0) {
      uVar4 = 0x20;
    }
    else {
      uVar4 = 0;
      if (intConstantValue != 0) {
        for (; ((uint)intConstantValue >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
    }
    goto LAB_0045bd5f;
  case InlineMathCeil:
  case InlineMathFloor:
  case InlineMathRound:
    goto switchD_0045ba62_caseD_25e;
  case InlineMathFround:
    local_48 = (double)intConstantValue;
    break;
  default:
    if (OVar1 != ToVar) {
      if (OVar1 != LdC_A_I4) {
        return false;
      }
      goto LAB_0045bb48;
    }
    goto switchD_0045ba62_caseD_25e;
  }
  bVar17 = true;
  intConstantValue = 0;
  bVar6 = false;
LAB_0045bd6e:
  CaptureByteCodeSymUses(this,*pInstr);
  if (((*pInstr)->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ccf,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar8) goto LAB_0045c380;
    *puVar12 = 0;
  }
  if (!bVar6) {
    intConstantValue = (int32)local_48;
    if ((local_48 == (double)(int)local_48) && (!NAN(local_48) && !NAN((double)(int)local_48))) {
      bVar6 = true;
    }
  }
  if (bVar6) {
    newSrc = IR::IntConstOpnd::New((long)intConstantValue,TyInt32,(*pInstr)->m_func,false);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar10,uVar11);
    if (bVar8) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %d\n",(ulong)(uint)intConstantValue);
LAB_0045bfc0:
      Output::Flush();
    }
  }
  else {
    newSrc = (IntConstOpnd *)IR::FloatConstOpnd::New(local_48,TyFloat64,(*pInstr)->m_func);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar10 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar11 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar10,uVar11);
    if (bVar8) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %f\n",local_48._0_4_);
      goto LAB_0045bfc0;
    }
  }
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  dst = (GlobOpt *)(*pInstr)->m_dst;
  OVar7 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ce8,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar8) goto LAB_0045c380;
    *puVar12 = 0;
  }
  OVar7 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar8) goto LAB_0045c380;
    *puVar12 = 0;
  }
  if (bVar6) {
    pSVar3 = (StackSym *)dst->intConstantToStackSymMap;
    if (((pSVar3->field_0x18 & 1) != 0) && ((pSVar3->field_5).m_instrDef != (Instr *)0x0)) {
      StackSym::SetIsIntConst(pSVar3,(long)intConstantValue);
    }
    if (bVar17) {
      pVVar15 = GetIntConstantValue(this,intConstantValue,*pInstr,(Opnd *)dst);
      *pDstVal = pVVar15;
    }
    bVar6 = IsTypeSpecPhaseOff(this->func);
    pIVar2 = *pInstr;
    if (bVar6) {
      pIVar2->m_opcode = LdC_A_I4;
LAB_0045c151:
      this_01 = (char *)dst;
      OVar7 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        this_01 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) {
LAB_0045c380:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar12 = 0;
      }
      ToVarStackSym((GlobOpt *)this_01,(StackSym *)dst->intConstantToStackSymMap,this->currentBlock)
      ;
    }
    else {
      pIVar2->m_opcode = Ld_I4;
      OVar7 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_0045c380;
        *puVar12 = 0;
      }
      ToInt32Dst(this,pIVar2,(RegOpnd *)dst,this->currentBlock);
      this_00 = (*pInstr)->m_dst;
      OVar7 = IR::Opnd::GetKind(this_00);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_0045c380;
        *puVar12 = 0;
      }
      pSVar3 = (StackSym *)this_00[1]._vptr_Opnd;
      if (((pSVar3->field_0x18 & 1) != 0) && ((pSVar3->field_5).m_instrDef != (Instr *)0x0)) {
        StackSym::SetIsIntConst(pSVar3,(long)intConstantValue);
      }
    }
  }
  else {
    pVVar15 = NewFloatConstantValue(this,local_48,(Opnd *)dst);
    *pDstVal = pVVar15;
    bVar6 = IsTypeSpecPhaseOff(this->func);
    pIVar2 = *pInstr;
    if (bVar6) {
      pIVar2->m_opcode = LdC_A_R8;
      goto LAB_0045c151;
    }
    pIVar2->m_opcode = LdC_F8_R8;
    OVar7 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_0045c380;
      *puVar12 = 0;
    }
    ToFloat64Dst(this,pIVar2,(RegOpnd *)dst,this->currentBlock);
  }
  InvalidateInductionVariables(this,*pInstr);
  bVar6 = true;
switchD_0045ba62_caseD_252:
  return bVar6;
switchD_0045ba62_caseD_25e:
  IR::Instr::ClearBailOutInfo(pIVar2);
  uVar4 = intConstantValue;
LAB_0045bd5f:
  intConstantValue = uVar4;
  local_48 = 0.0;
  bVar17 = true;
  bVar6 = true;
  goto LAB_0045bd6e;
}

Assistant:

bool
GlobOpt::OptConstFoldUnary(
    IR::Instr * *pInstr,
    const int32 intConstantValue,
    const bool isUsingOriginalSrc1Value,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value = 0;
    IR::Opnd *constOpnd;
    bool isInt = true;
    bool doSetDstVal = true;
    FloatConstType fValue = 0.0;

    if (!DoConstFold())
    {
        return false;
    }

    if (instr->GetDst() && !instr->GetDst()->IsRegOpnd())
    {
        return false;
    }

    switch(instr->m_opcode)
    {
    case Js::OpCode::Neg_A:
        if (intConstantValue == 0)
        {
            // Could fold to -0.0
            return false;
        }

        if (Int32Math::Neg(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Not_A:
        Int32Math::Not(intConstantValue, &value);
        break;

    case Js::OpCode::Ld_A:
        if (instr->HasBailOutInfo())
        {
            //The profile data for switch expr can be string and in GlobOpt we realize it is an int.
            if(instr->GetBailOutKind() == IR::BailOutExpectingString)
            {
                throw Js::RejitException(RejitReason::DisableSwitchOptExpectingString);
            }
            Assert(instr->GetBailOutKind() == IR::BailOutExpectingInteger);
            instr->ClearBailOutInfo();
        }
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Conv_Num:
    case Js::OpCode::LdC_A_I4:
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Incr_A:
        if (Int32Math::Inc(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Decr_A:
        if (Int32Math::Dec(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::InlineMathAcos:
        fValue = Js::Math::Acos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAsin:
        fValue = Js::Math::Asin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAtan:
        fValue = Js::Math::Atan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathCos:
        fValue = Js::Math::Cos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathExp:
        fValue = Js::Math::Exp((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathLog:
        fValue = Js::Math::Log((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSin:
        fValue = Js::Math::Sin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSqrt:
        fValue = ::sqrt((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathTan:
        fValue = ::tan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathFround:
        fValue = (double) (float) intConstantValue;
        isInt = false;
        break;

    case Js::OpCode::InlineMathAbs:
        if (intConstantValue == INT32_MIN)
        {
            if (instr->GetDst()->IsInt32())
            {
                // if dst is an int (e.g. in asm.js), we should coerce it, not convert to float
                value = static_cast<int32>(2147483648U);
            }
            else
            {
                // Rejit with AggressiveIntTypeSpecDisabled for Math.abs(INT32_MIN) because it causes dst
                // to be float type which could be different with previous type spec result in LoopPrePass
                throw Js::RejitException(RejitReason::AggressiveIntTypeSpecDisabled);
            }
        }
        else
        {
            value = ::abs(intConstantValue);
        }
        break;

    case Js::OpCode::InlineMathClz:
        DWORD clz;
        if (_BitScanReverse(&clz, intConstantValue))
        {
            value = 31 - clz;
        }
        else
        {
            value = 32;
        }
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::Ctz:
        Assert(func->GetJITFunctionBody()->IsWasmFunction());
        Assert(!instr->HasBailOutInfo());
        DWORD ctz;
        if (_BitScanForward(&ctz, intConstantValue))
        {
            value = ctz;
        }
        else
        {
            value = 32;
        }
        break;

    case Js::OpCode::InlineMathFloor:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathCeil:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathRound:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;
    case Js::OpCode::ToVar:
        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return false;
        }
        else
        {
            value = intConstantValue;
            instr->ClearBailOutInfo();
            break;
        }
    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    Assert(!instr->HasBailOutInfo()); // If we are, in fact, successful in constant folding the instruction, there is no point in having the bailoutinfo around anymore.
                                      // Make sure that it is cleared if it was initially present.
    if (!isInt)
    {
        value = (int32)fValue;
        if (fValue == (double)value)
        {
            isInt = true;
        }
    }
    if (isInt)
    {
        constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %d\n"), value);
    }
    else
    {
        constOpnd = IR::FloatConstOpnd::New(fValue, TyFloat64, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %f\n"), fValue);
    }
    instr->ReplaceSrc1(constOpnd);

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (isInt)
    {
        if (dstSym->IsSingleDef())
        {
            dstSym->SetIsIntConst(value);
        }

        if (doSetDstVal)
        {
            *pDstVal = GetIntConstantValue(value, instr, dst);
        }

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_I4;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_I4;
            this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);

            StackSym * currDstSym = instr->GetDst()->AsRegOpnd()->m_sym;
            if (currDstSym->IsSingleDef())
            {
                currDstSym->SetIsIntConst(value);
            }
        }
    }
    else
    {
        *pDstVal = NewFloatConstantValue(fValue, dst);

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_R8;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::LdC_F8_R8;
            this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
        }
    }

    InvalidateInductionVariables(instr);

    return true;
}